

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

void __thiscall QCss::Declaration::brushValues(Declaration *this,QBrush *c,QPalette *pal)

{
  QColor color;
  bool bVar1;
  int iVar2;
  const_reference pQVar3;
  QColor *pQVar4;
  DeclarationData *pDVar5;
  Promoted<long_long,_int> PVar6;
  QVariant *in_RDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  int i;
  int needParse;
  BrushData data;
  Value *in_stack_00000068;
  QList<QVariant> v_1;
  QList<QVariant> v;
  undefined4 in_stack_fffffffffffffe98;
  ColorRole in_stack_fffffffffffffe9c;
  QPalette *in_stack_fffffffffffffea0;
  QVariant *in_stack_fffffffffffffea8;
  int local_140;
  uint local_13c;
  int local_fc;
  qsizetype local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  int local_cc;
  qsizetype local_c8;
  QList<QVariant> local_c0;
  undefined8 local_98;
  undefined8 local_90;
  QVariant local_88 [2];
  QVariant local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_13c = 0x1f;
  local_140 = 0;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f7ea);
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffea0);
  if (bVar1) {
    local_13c = 0;
    local_c0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c0.d.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    local_c0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f83e);
    ::QVariant::toList();
    local_140 = 0;
    while( true ) {
      local_c8 = QList<QVariant>::size(&local_c0);
      local_cc = 4;
      PVar6 = qMin<long_long,int>(&local_c8,&local_cc);
      if (PVar6 <= local_140) break;
      QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffea0,
                          CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      iVar2 = ::QVariant::userType((QVariant *)0xa2f8c4);
      if (iVar2 == 0x1002) {
        QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffea0,
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        qvariant_cast<QBrush>(in_RDI);
        QBrush::operator=((QBrush *)in_stack_fffffffffffffea0,
                          (QBrush *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        QBrush::~QBrush((QBrush *)0xa2f918);
      }
      else {
        QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffea0,
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        iVar2 = ::QVariant::userType((QVariant *)0xa2f937);
        if (iVar2 == 2) {
          in_stack_fffffffffffffea8 = in_RDX;
          pQVar3 = QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffea0,
                                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                                      );
          ::QVariant::toInt((bool *)pQVar3);
          pQVar4 = QPalette::color(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          local_98 = *(undefined8 *)pQVar4;
          local_90 = *(undefined8 *)((long)&pQVar4->ct + 4);
          color._8_8_ = in_stack_fffffffffffffea8;
          color._0_8_ = in_stack_fffffffffffffea0;
          QBrush::operator=((QBrush *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            color);
        }
        else {
          local_13c = 1 << ((byte)local_140 & 0x1f) | local_13c;
        }
      }
      local_140 = local_140 + 1;
    }
    QList<QVariant>::~QList((QList<QVariant> *)0xa2f9e3);
  }
  if (local_13c != 0) {
    local_f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    local_e0 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QVariant>::QList((QList<QVariant> *)0xa2fa22);
    local_140 = 0;
    while( true ) {
      in_stack_fffffffffffffea0 = (QPalette *)(long)local_140;
      pDVar5 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa2fa3e);
      local_f8 = QList<QCss::Value>::size(&pDVar5->values);
      local_fc = 4;
      PVar6 = qMin<long_long,int>(&local_f8,&local_fc);
      if (PVar6 <= (long)in_stack_fffffffffffffea0) break;
      if ((local_13c & 1 << ((byte)local_140 & 0x1f)) != 0) {
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2fab6);
        QList<QCss::Value>::at
                  ((QList<QCss::Value> *)in_stack_fffffffffffffea0,
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        parseBrushValue(in_stack_00000068,(QPalette *)data._8_8_);
        ::QVariant::fromValue<QBrush>((QBrush *)in_stack_fffffffffffffea8);
        QList<QVariant>::operator+=
                  ((QList<QVariant> *)in_stack_fffffffffffffea0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        ::QVariant::~QVariant(local_48);
        QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
        BrushData::~BrushData((BrushData *)0xa2fbf8);
      }
      local_140 = local_140 + 1;
    }
    if ((local_13c & 0x10) != 0) {
      ::QVariant::QVariant(local_88,(QList_conflict3 *)&local_f0);
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2fc30);
      ::QVariant::operator=(in_stack_fffffffffffffea8,(QVariant *)in_stack_fffffffffffffea0);
      ::QVariant::~QVariant(local_88);
    }
    QList<QVariant>::~QList((QList<QVariant> *)0xa2fc5b);
  }
  if (local_140 == 0) {
    QBrush::QBrush((QBrush *)in_stack_fffffffffffffea0);
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea0,
                      (QBrush *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
    QBrush::~QBrush((QBrush *)0xa2fcb8);
  }
  else if (local_140 == 1) {
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
  }
  else if (local_140 == 2) {
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
  }
  else if (local_140 == 3) {
    QBrush::operator=((QBrush *)in_stack_fffffffffffffea8,(QBrush *)in_stack_fffffffffffffea0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Declaration::brushValues(QBrush *c, const QPalette &pal) const
{
    int needParse = 0x1f; // bits 0..3 say if we should parse the corresponding value.
                          // the bit 4 say we need to update d->parsed
    int i = 0;
    if (d->parsed.isValid()) {
        needParse = 0;
        Q_ASSERT(d->parsed.metaType() == QMetaType::fromType<QList<QVariant>>());
        QList<QVariant> v = d->parsed.toList();
        for (i = 0; i < qMin(v.size(), 4); i++) {
            if (v.at(i).userType() == QMetaType::QBrush) {
                c[i] = qvariant_cast<QBrush>(v.at(i));
            } else if (v.at(i).userType() == QMetaType::Int) {
                c[i] = pal.color((QPalette::ColorRole)(v.at(i).toInt()));
            } else {
                needParse |= (1<<i);
            }
        }
    }
    if (needParse != 0) {
        QList<QVariant> v;
        for (i = 0; i < qMin(d->values.size(), 4); i++) {
            if (!(needParse & (1<<i)))
                continue;
            BrushData data = parseBrushValue(d->values.at(i), pal);
            if (data.type == BrushData::Role) {
                v += QVariant::fromValue<int>(data.role);
                c[i] = pal.color((QPalette::ColorRole)(data.role));
            } else {
                if (data.type != BrushData::DependsOnThePalette) {
                    v += QVariant::fromValue<QBrush>(data.brush);
                } else {
                    v += QVariant();
                }
                c[i] = data.brush;
            }
        }
        if (needParse & 0x10)
            d->parsed = v;
    }
    if (i == 0) c[0] = c[1] = c[2] = c[3] = QBrush();
    else if (i == 1) c[3] = c[2] = c[1] = c[0];
    else if (i == 2) c[2] = c[0], c[3] = c[1];
    else if (i == 3) c[3] = c[1];
}